

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<(anonymous_namespace)::mini_set,_mvm::bytecode_serializer>::assemble
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          assembler<(anonymous_namespace)::mini_set,_mvm::bytecode_serializer> *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  array<unsigned_char,_4UL> aVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  array<unsigned_char,_4UL> ser;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  istringstream iss;
  undefined8 local_260;
  undefined1 local_250 [23];
  allocator_type local_239;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_208;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1d8;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)this,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_1d8,(istream_type *)local_1a8);
  paVar1 = &local_208._M_value.field_2;
  local_208._M_stream = (istream_type *)0x0;
  local_208._M_value._M_string_length = 0;
  local_208._M_value.field_2._M_local_buf[0] = '\0';
  local_208._M_ok = false;
  local_208._M_value._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_220,
             &local_1d8,&local_208,(allocator_type *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_value._M_dataplus._M_p,
                    CONCAT71(local_208._M_value.field_2._M_allocated_capacity._1_7_,
                             local_208._M_value.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_value._M_dataplus._M_p != &local_1d8._M_value.field_2) {
    operator_delete(local_1d8._M_value._M_dataplus._M_p,
                    local_1d8._M_value.field_2._M_allocated_capacity + 1);
  }
  if (local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] no instruction token","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 1;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  }
  uVar6 = 4;
  lVar7 = 0x18;
  local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_220;
  do {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_260,*(char ***)(&UNK_0011dc50 + lVar7));
    if (bVar2) {
      lVar7 = lVar7 + -0x18;
      goto LAB_00102c7d;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_260,*(char ***)(&UNK_0011dc58 + lVar7));
    if (bVar2) {
      if (lVar7 == 0x78) goto LAB_0010337f;
      lVar7 = lVar7 + -0x10;
      goto LAB_00102c7d;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_260,*(char ***)(&UNK_0011dc60 + lVar7));
    if (bVar2) {
      lVar7 = lVar7 + -8;
      goto LAB_00102c7d;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_260,
                         *(char ***)
                          ((long)traits::instr_set_traits<(anonymous_namespace)::mini_set>::
                                 instr_names._M_elems + lVar7));
    if (bVar2) goto LAB_00102c7d;
    uVar6 = uVar6 - 1;
    lVar7 = lVar7 + 0x20;
  } while (1 < uVar6);
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
          ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                        *)&local_260,(char **)"rotln");
  lVar7 = 0x60;
  if (!bVar2) {
LAB_0010337f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction name","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 2;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  }
LAB_00102c7d:
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(lVar7 >> 3) {
  case 0:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                ((ulong)local_260 & 0xffffffffffffff00);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l,&local_239);
    if ((long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    aVar3 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>
                      (local_220.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_260._4_4_,aVar3._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_260,(uchar *)((long)&local_260 + 4),&local_238);
    break;
  case 1:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,1);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_00,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,2);
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_10,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,3);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_01,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,4);
    __l_11._M_len = 1;
    __l_11._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_11,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 5:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,5);
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_09,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 6:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,6);
    __l_08._M_len = 1;
    __l_08._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_08,&local_239)
    ;
    if ((long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    aVar3 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>
                      (local_220.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_260._4_4_,aVar3._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_260,(uchar *)((long)&local_260 + 4),&local_238);
    break;
  case 7:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,7);
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_06,&local_239)
    ;
    if ((long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    aVar3 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>
                      (local_220.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_260._4_4_,aVar3._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_260,(uchar *)((long)&local_260 + 4),&local_238);
    break;
  case 8:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,8);
    __l_07._M_len = 1;
    __l_07._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_07,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 9:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,9);
    __l_05._M_len = 1;
    __l_05._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_05,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 10:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,10);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_03,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 0xb:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,0xb);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_02,&local_239)
    ;
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 0xc:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_260._1_7_,0xc);
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)&local_260;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_04,&local_239)
    ;
    if ((long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"[-][mvm] invalid instruction operands","");
      *puVar5 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar5 + 1) = 4;
      __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
    }
    aVar3 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>
                      (local_220.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_260._4_4_,aVar3._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_260,(uchar *)((long)&local_260 + 4),&local_238);
    break;
  case 0xd:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x10:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x11:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x12:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x13:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x14:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x15:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x16:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x17:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x18:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x19:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x20:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x21:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x22:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x23:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x24:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x25:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x26:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x27:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x28:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x29:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x30:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x31:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x32:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x33:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x34:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x35:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x36:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x37:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x38:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x39:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x40:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x41:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x42:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x43:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x44:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x45:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x46:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x47:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x48:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x49:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x50:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x51:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x52:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x53:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x54:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x55:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x56:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x57:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x58:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x59:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x60:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x61:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x62:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 99:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 100:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x65:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x66:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x67:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x68:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x69:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x70:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x71:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x72:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x73:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x74:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x75:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x76:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x77:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x78:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x79:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x80:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x81:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x82:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x83:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x84:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x85:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x86:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x87:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x88:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x89:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x90:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x91:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x92:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x93:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x94:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x95:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x96:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x97:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x98:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x99:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9a:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9b:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9d:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9f:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa0:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa1:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa2:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa3:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa4:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa5:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa6:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa7:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa8:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa9:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaa:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xab:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xac:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xad:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xae:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaf:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb0:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb1:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb2:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb3:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb4:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb5:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb6:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb7:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb8:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb9:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xba:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbb:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbc:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbd:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbe:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbf:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc0:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc1:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc2:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc3:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc4:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc5:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc6:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 199:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 200:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc9:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xca:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcb:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcc:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcd:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xce:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcf:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd0:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd1:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd2:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd3:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd4:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd5:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd6:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd7:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd8:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd9:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xda:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdb:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdc:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdd:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xde:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdf:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe0:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe1:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe2:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe3:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe4:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe5:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe6:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe7:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe8:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe9:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xea:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xeb:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xec:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xed:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xee:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xef:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf0:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf1:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf2:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf3:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf4:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf5:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf6:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf7:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf8:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf9:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfa:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfb:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfc:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfd:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfe:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xff:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] invalid instruction opcode","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 5;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  default:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"[-][mvm] instruction opcode overflow","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 3;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start =
       local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish =
       local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_220);
  std::__cxx11::istringstream::~istringstream(local_1a8);
  pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::ios_base::~ios_base(local_130);
  return pvVar4;
}

Assistant:

std::vector<uint8_t>
assembler<Set, MetaCodeImpl>::assemble(std::string const &line) const {
  std::istringstream iss(line);
  std::vector<std::string> tokens(std::istream_iterator<std::string>{iss},
                                  std::istream_iterator<std::string>());

  if (tokens.empty()) // need at leat an instruction name
  {
    throw mexcept("[-][mvm] no instruction token", status_type::NO_INSTR_NAME);
  }

  auto iname_it = std::find_if(
      std::cbegin(instr_set_traits_type::instr_names),
      std::cend(instr_set_traits_type::instr_names),
      [&](auto const &val) { return std::string(val) == tokens[0]; });

  if (iname_it == std::cend(instr_set_traits_type::instr_names)) {
    throw mexcept("[-][mvm] invalid instruction name",
                  status_type::BAD_INSTR_NAME);
  }

  LOG_INFO("assembler -> assemble instruction " << *iname_it);

  std::vector<uint8_t> bytecode;
  auto instr_index =
      std::distance(std::cbegin(instr_set_traits_type::instr_names), iname_it);

#ifdef FASTI
#define MVM_ASSEMBLE_I(n)                                                      \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      bytecode = assemble_instr<instr_type>(                                   \
          static_cast<uint8_t>(n),                                             \
          (tokens.erase(std::begin(tokens)), tokens));                         \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;
  switch (instr_index) {
    MVM_UNROLL_256(MVM_ASSEMBLE_I)
  default:
    throw mexcept("[-][mvm] instruction opcode overflow",
                  status_type::INSTR_OPCODE_OVERFLOW);
  }
#else
  // visitor version suitable for small instruction sets
  instr_set_visitor<instr_set_desc_type>()(
      instr_index, [&tokens, &bytecode, instr_index, this](auto &&arg) {
        using instr_type = std::decay_t<decltype(arg)>;
        tokens.erase(std::begin(tokens));
        bytecode = this->assemble_instr<instr_type>(
            static_cast<uint8_t>(instr_index), tokens);
      });
#endif

  return bytecode;
}